

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int getsumalgorithm(xmlattr_list *list)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  while (list = (xmlattr_list *)((xmlattr *)list)->next, (xmlattr *)list != (xmlattr *)0x0) {
    iVar2 = strcmp(((xmlattr *)list)->name,"style");
    if (iVar2 == 0) {
      pbVar1 = (byte *)((xmlattr *)list)->value;
      if (((((*pbVar1 | 0x20) == 0x73) && ((pbVar1[1] | 0x20) == 0x68)) &&
          ((pbVar1[2] | 0x20) == 0x61)) && ((pbVar1[3] == 0x31 && (pbVar1[4] == 0)))) {
        iVar3 = 1;
      }
      if ((((*pbVar1 | 0x20) == 0x6d) && ((pbVar1[1] | 0x20) == 100)) &&
         ((pbVar1[2] == 0x35 && (pbVar1[3] == 0)))) {
        iVar3 = 2;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
getsumalgorithm(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	int alg = CKSUM_NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			const char *v = attr->value;
			if ((v[0] == 'S' || v[0] == 's') &&
			    (v[1] == 'H' || v[1] == 'h') &&
			    (v[2] == 'A' || v[2] == 'a') &&
			    v[3] == '1' && v[4] == '\0')
				alg = CKSUM_SHA1;
			if ((v[0] == 'M' || v[0] == 'm') &&
			    (v[1] == 'D' || v[1] == 'd') &&
			    v[2] == '5' && v[3] == '\0')
				alg = CKSUM_MD5;
		}
	}
	return (alg);
}